

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

double __thiscall HModel::computePrObj(HModel *this)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  int col;
  int var;
  int row;
  double prObj;
  undefined4 local_1c;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0.0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x610); local_14 = local_14 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_14);
    iVar2 = *pvVar3;
    if (iVar2 < *(int *)(in_RDI + 0x60c)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x870),(long)local_14
                         );
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)iVar2);
      local_10 = dVar1 * *pvVar4 + local_10;
    }
  }
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x60c); local_1c = local_1c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_1c);
    if (*pvVar3 != 0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)local_1c
                         );
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)local_1c
                         );
      local_10 = dVar1 * *pvVar4 + local_10;
    }
  }
  return local_10;
}

Assistant:

double HModel::computePrObj() {
    double prObj = 0;
    for (int row = 0; row < numRow; row++) {
      int var = basicIndex[row];
      if (var < numCol) prObj += baseValue[row]*colCost[var];
    }
    for (int col = 0; col < numCol; col++)
        if (nonbasicFlag[col]) prObj += workValue[col]*colCost[col];
    return prObj;
}